

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filter_tests.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  bool bVar1;
  UnitTestSource *pUVar2;
  int iVar3;
  STATE in_stack_00000034;
  STATE in_stack_00000038;
  STATE in_stack_0000003c;
  STATE in_stack_00000040;
  STATE in_stack_00000044;
  char *in_stack_00000048;
  STATE in_stack_00000240;
  int local_14;
  
  local_14 = argc;
  pUVar2 = iutest::UnitTestSource::GetInstance();
  iutest::UnitTestSource::Initialize(pUVar2);
  iutest::TestEnv::ParseCommandLine<char>(&local_14,argv);
  iutest::TestEnv::LoadFlagFile();
  pUVar2 = iutest::UnitTestSource::GetInstance();
  iutest::UnitTestSource::SetUpDefaultXmlListener(pUVar2);
  iVar3 = 1;
  bVar1 = FilterTest(in_stack_00000048,in_stack_00000044,in_stack_00000040,in_stack_0000003c,
                     in_stack_00000038,in_stack_00000034,in_stack_00000240);
  if (bVar1) {
    iVar3 = 1;
    bVar1 = FilterTest(in_stack_00000048,in_stack_00000044,in_stack_00000040,in_stack_0000003c,
                       in_stack_00000038,in_stack_00000034,in_stack_00000240);
    if (bVar1) {
      iVar3 = 1;
      bVar1 = FilterTest(in_stack_00000048,in_stack_00000044,in_stack_00000040,in_stack_0000003c,
                         in_stack_00000038,in_stack_00000034,in_stack_00000240);
      if (bVar1) {
        iVar3 = 1;
        bVar1 = FilterTest(in_stack_00000048,in_stack_00000044,in_stack_00000040,in_stack_0000003c,
                           in_stack_00000038,in_stack_00000034,in_stack_00000240);
        if (bVar1) {
          iVar3 = 1;
          bVar1 = FilterTest(in_stack_00000048,in_stack_00000044,in_stack_00000040,in_stack_0000003c
                             ,in_stack_00000038,in_stack_00000034,in_stack_00000240);
          if (bVar1) {
            iVar3 = 1;
            bVar1 = FilterTest(in_stack_00000048,in_stack_00000044,in_stack_00000040,
                               in_stack_0000003c,in_stack_00000038,in_stack_00000034,
                               in_stack_00000240);
            if (bVar1) {
              iVar3 = 1;
              bVar1 = FilterTest(in_stack_00000048,in_stack_00000044,in_stack_00000040,
                                 in_stack_0000003c,in_stack_00000038,in_stack_00000034,
                                 in_stack_00000240);
              if (bVar1) {
                iVar3 = 1;
                bVar1 = FilterTest(in_stack_00000048,in_stack_00000044,in_stack_00000040,
                                   in_stack_0000003c,in_stack_00000038,in_stack_00000034,
                                   in_stack_00000240);
                if (bVar1) {
                  iVar3 = 1;
                  bVar1 = FilterTest(in_stack_00000048,in_stack_00000044,in_stack_00000040,
                                     in_stack_0000003c,in_stack_00000038,in_stack_00000034,
                                     in_stack_00000240);
                  if (bVar1) {
                    iVar3 = 1;
                    bVar1 = FilterTest(in_stack_00000048,in_stack_00000044,in_stack_00000040,
                                       in_stack_0000003c,in_stack_00000038,in_stack_00000034,
                                       in_stack_00000240);
                    if (bVar1) {
                      iVar3 = 1;
                      bVar1 = FilterTest(in_stack_00000048,in_stack_00000044,in_stack_00000040,
                                         in_stack_0000003c,in_stack_00000038,in_stack_00000034,
                                         in_stack_00000240);
                      if (bVar1) {
                        iVar3 = 1;
                        bVar1 = FilterTest(in_stack_00000048,in_stack_00000044,in_stack_00000040,
                                           in_stack_0000003c,in_stack_00000038,in_stack_00000034,
                                           in_stack_00000240);
                        if (bVar1) {
                          puts("*** Successful ***");
                          iVar3 = 0;
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return iVar3;
}

Assistant:

int main(int argc, char* argv[])
#endif
{
    IUTEST_INIT(&argc, argv);

    if( !FilterTest("*Test*"
        , TestHoge::RAN
        , HogeTest::RAN
        , FooBar::NOT_RAN
        , FooBaz::NOT_RAN
        , FooBarTest::RAN
        , FooQux::NOT_RAN
    ) ) {
        return 1;
    }

    if( !FilterTest("-*Test*"
        , TestHoge::NOT_RAN
        , HogeTest::NOT_RAN
        , FooBar::RAN
        , FooBaz::RAN
        , FooBarTest::NOT_RAN
        , FooQux::RAN
    ) ) {
        return 1;
    }

    if( !FilterTest("Foo.Bar"
        , TestHoge::NOT_RAN
        , HogeTest::NOT_RAN
        , FooBar::RAN
        , FooBaz::NOT_RAN
        , FooBarTest::NOT_RAN
        , FooQux::NOT_RAN
    ) ) {
        return 1;
    }

    if( !FilterTest("***.Bar"
        , TestHoge::NOT_RAN
        , HogeTest::NOT_RAN
        , FooBar::RAN
        , FooBaz::NOT_RAN
        , FooBarTest::NOT_RAN
        , FooQux::NOT_RAN
    ) ) {
        return 1;
    }

    if( !FilterTest("???.Ba?"
        , TestHoge::NOT_RAN
        , HogeTest::NOT_RAN
        , FooBar::RAN
        , FooBaz::RAN
        , FooBarTest::NOT_RAN
        , FooQux::NOT_RAN
    ) ) {
        return 1;
    }

    if( !FilterTest("???.Ba?"
        , TestHoge::NOT_RAN
        , HogeTest::NOT_RAN
        , FooBar::RAN
        , FooBaz::RAN
        , FooBarTest::NOT_RAN
        , FooQux::NOT_RAN
    ) ) {
        return 1;
    }

    if( !FilterTest("Foo.Ba*-*Test*"
        , TestHoge::NOT_RAN
        , HogeTest::NOT_RAN
        , FooBar::RAN
        , FooBaz::RAN
        , FooBarTest::NOT_RAN
        , FooQux::NOT_RAN
    ) ) {
        return 1;
    }

    if( !FilterTest("Foo.Ba*:-*Test*"
        , TestHoge::NOT_RAN
        , HogeTest::NOT_RAN
        , FooBar::RAN
        , FooBaz::RAN
        , FooBarTest::NOT_RAN
        , FooQux::NOT_RAN
    ) ) {
        return 1;
    }

    if( !FilterTest("-*Test*:*Baz*"
        , TestHoge::NOT_RAN
        , HogeTest::NOT_RAN
        , FooBar::RAN
        , FooBaz::NOT_RAN
        , FooBarTest::NOT_RAN
        , FooQux::RAN
    ) ) {
        return 1;
    }

    if( !FilterTest("Foo.Ba*-*Test*:*Baz*"
        , TestHoge::NOT_RAN
        , HogeTest::NOT_RAN
        , FooBar::RAN
        , FooBaz::NOT_RAN
        , FooBarTest::NOT_RAN
        , FooQux::NOT_RAN
    ) ) {
        return 1;
    }

    if( !FilterTest("*Baz*:*Qux*"
        , TestHoge::NOT_RAN
        , HogeTest::NOT_RAN
        , FooBar::NOT_RAN
        , FooBaz::RAN
        , FooBarTest::NOT_RAN
        , FooQux::RAN
    ) ) {
        return 1;
    }

    if( !FilterTest(":::*Baz*:::::*Qux*:::"
        , TestHoge::NOT_RAN
        , HogeTest::NOT_RAN
        , FooBar::NOT_RAN
        , FooBaz::RAN
        , FooBarTest::NOT_RAN
        , FooQux::RAN
    ) ) {
        return 1;
    }

    printf("*** Successful ***\n");
    return 0;
}